

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::DefaultsTest::CompareAndLog
          (DefaultsTest *this,GLfloat *value_ref,GLfloat *value_dst,GLenum pname)

{
  ostringstream *this_00;
  MessageBuilder *pMVar1;
  float fVar2;
  float fVar3;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  fVar2 = *value_ref - *value_dst;
  fVar3 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar3 = fVar2;
  }
  if (fVar3 <= 0.0125) {
    fVar2 = value_ref[1] - value_dst[1];
    fVar3 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar3 = fVar2;
    }
    if (fVar3 <= 0.0125) {
      fVar2 = value_ref[2] - value_dst[2];
      fVar3 = -fVar2;
      if (-fVar2 <= fVar2) {
        fVar3 = fVar2;
      }
      if (fVar3 <= 0.0125) {
        fVar2 = value_ref[3] - value_dst[3];
        fVar3 = -fVar2;
        if (-fVar2 <= fVar2) {
          fVar3 = fVar2;
        }
        if (fVar3 <= 0.0125) {
          return true;
        }
      }
    }
  }
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Queried value of pname ");
  local_1b8.m_getName = glu::getTextureParameterName;
  local_1b8.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
  std::operator<<((ostream *)this_00," is equal to [");
  pMVar1 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,value_dst);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst + 1);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst + 2);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst + 3);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], however ")
  ;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_ref);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_ref + 1);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_ref + 2);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_ref + 3);
  std::operator<<(&(pMVar1->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  "] was expected. Test fails.");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  return false;
}

Assistant:

bool DefaultsTest::CompareAndLog(glw::GLfloat value_ref[4], glw::GLfloat value_dst[4], glw::GLenum pname)
{
	if ((de::abs(value_ref[0] - value_dst[0]) > 0.0125 /* Precision */) ||
		(de::abs(value_ref[1] - value_dst[1]) > 0.0125 /* Precision */) ||
		(de::abs(value_ref[2] - value_dst[2]) > 0.0125 /* Precision */) ||
		(de::abs(value_ref[3] - value_dst[3]) > 0.0125 /* Precision */))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Queried value of pname " << glu::getTextureParameterStr(pname)
			<< " is equal to [" << value_dst[0] << ", " << value_dst[1] << ", " << value_dst[2] << ", " << value_dst[3]
			<< "], however " << value_ref[0] << ", " << value_ref[1] << ", " << value_ref[2] << ", " << value_ref[3]
			<< "] was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}